

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O0

int GetDataBlock(gif_source_ptr sinfo,U_CHAR *buf)

{
  int iVar1;
  size_t sVar2;
  gif_source_ptr in_RSI;
  long in_RDI;
  int count;
  
  iVar1 = ReadByte(in_RSI);
  if ((0 < iVar1) &&
     (sVar2 = fread(in_RSI,1,(long)iVar1,*(FILE **)(in_RDI + 0x18)), sVar2 != (long)iVar1)) {
    *(undefined4 *)(**(long **)(in_RDI + 0x30) + 0x28) = 0x2b;
    (**(code **)**(undefined8 **)(in_RDI + 0x30))(*(undefined8 *)(in_RDI + 0x30));
  }
  return iVar1;
}

Assistant:

LOCAL(int)
GetDataBlock(gif_source_ptr sinfo, U_CHAR *buf)
/* Read a GIF data block, which has a leading count byte */
/* A zero-length block marks the end of a data block sequence */
{
  int count;

  count = ReadByte(sinfo);
  if (count > 0) {
    if (!ReadOK(sinfo->pub.input_file, buf, count))
      ERREXIT(sinfo->cinfo, JERR_INPUT_EOF);
  }
  return count;
}